

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::~cmInstallExportGenerator(cmInstallExportGenerator *this)

{
  cmInstallExportGenerator *this_local;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_0150f330;
  std::unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ::~unique_ptr(&this->EFGen);
  std::__cxx11::string::~string((string *)&this->MainImportFile);
  std::__cxx11::string::~string((string *)&this->TempDir);
  std::__cxx11::string::~string((string *)&this->CxxModulesDirectory);
  std::__cxx11::string::~string((string *)&this->Namespace);
  std::__cxx11::string::~string((string *)&this->FileName);
  std::__cxx11::string::~string((string *)&this->FilePermissions);
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallExportGenerator::~cmInstallExportGenerator() = default;